

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

void __thiscall
Dashel::DashelException::DashelException
          (DashelException *this,Source s,int se,char *reason,Stream *stream)

{
  int se_00;
  undefined4 in_register_00000034;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sourceToString_abi_cxx11_(&local_50,(DashelException *)CONCAT44(in_register_00000034,s),se);
  std::operator+(&local_d0,&local_50," (");
  _to_string_abi_cxx11_(&local_f0,(Dashel *)(ulong)(uint)se,se_00);
  std::operator+(&local_b0,&local_d0,&local_f0);
  std::operator+(&local_90,&local_b0,"): ");
  std::operator+(&local_70,&local_90,reason);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__runtime_error_00126b08;
  this->source = s;
  this->sysError = se;
  this->stream = stream;
  return;
}

Assistant:

DashelException::DashelException(Source s, int se, const char* reason, Stream* stream) :
		std::runtime_error(sourceToString(s) + " (" + _to_string(se) + "): " + reason),
		source(s),
		sysError(se),
		stream(stream)
	{
	}